

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_lib.c
# Opt level: O1

int EC_POINT_copy(EC_POINT *dst,EC_POINT *src)

{
  code *UNRECOVERED_JUMPTABLE;
  int iVar1;
  
  UNRECOVERED_JUMPTABLE = *(code **)(*(long *)dst + 0x68);
  if ((UNRECOVERED_JUMPTABLE != (code *)0x0) && (*(long *)dst == *(long *)src)) {
    if (dst != src) {
      iVar1 = (*UNRECOVERED_JUMPTABLE)();
      return iVar1;
    }
    return 1;
  }
  return 0;
}

Assistant:

int EC_POINT_copy(EC_POINT *dest, const EC_POINT *src)
{
    if (dest->meth->point_copy == 0) {
        return 0;
    }
    if (dest->meth != src->meth) {
        return 0;
    }
    if (dest == src)
        return 1;
    return dest->meth->point_copy(dest, src);
}